

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [16];
  bool bVar3;
  ImGuiID id;
  ImU32 IVar4;
  ImGuiContext *g;
  uint uVar5;
  char *text;
  int iVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 in_XMM0_Db;
  ImVec2 IVar11;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 in_XMM2_Qb;
  undefined8 uVar15;
  undefined1 auVar14 [16];
  float fVar16;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  ImVec2 local_140;
  ImGuiContext *local_138;
  ImU32 local_130;
  ImU32 local_12c;
  ImVec2 local_128;
  undefined8 uStack_120;
  char *local_118;
  ImVec2 local_110;
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImGuiWindow *local_a0;
  float local_98;
  float fStack_94;
  undefined8 uStack_90;
  ImRect local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImRect local_40;
  
  local_138 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  local_a0->WriteAccessed = true;
  uVar7 = 0xffffffff;
  if (local_a0->SkipItems == false) {
    local_108._8_8_ = in_XMM2_Qb;
    local_108._0_8_ = frame_size;
    local_c8 = scale_max;
    local_b8 = scale_min;
    uStack_b4 = in_XMM0_Db;
    uStack_b0 = in_XMM0_Dc;
    uStack_ac = in_XMM0_Dd;
    id = ImGuiWindow::GetID(local_a0,label,(char *)0x0);
    IVar11 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar15 = local_108._8_8_;
    auVar13._8_4_ = (int)extraout_XMM0_Qb;
    auVar13._0_4_ = IVar11.x;
    auVar13._4_4_ = IVar11.y;
    auVar13._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
    local_98 = IVar11.x;
    fStack_94 = IVar11.y;
    uStack_90 = extraout_XMM0_Qb;
    if ((local_108._0_4_ == 0.0) && (!NAN(local_108._0_4_))) {
      fVar8 = CalcItemWidth();
      auVar1._4_8_ = uVar15;
      auVar1._0_4_ = local_108._4_4_;
      auVar14._0_8_ = auVar1._0_8_ << 0x20;
      auVar14._8_4_ = local_108._8_4_;
      auVar14._12_4_ = local_108._12_4_;
      auVar13._4_4_ = fStack_94;
      auVar13._0_4_ = local_98;
      auVar13._8_8_ = uStack_90;
      local_108._4_12_ = auVar14._4_12_;
      local_108._0_4_ = fVar8;
    }
    if ((local_108._4_4_ == 0.0) && (!NAN(local_108._4_4_))) {
      fVar8 = (local_138->Style).FramePadding.y;
      local_108._4_4_ = fVar8 + fVar8 + auVar13._4_4_;
      auVar13._4_4_ = fStack_94;
      auVar13._0_4_ = local_98;
      auVar13._8_8_ = uStack_90;
    }
    local_88.Min = (local_a0->DC).CursorPos;
    local_f8 = local_88.Min.x;
    local_e8 = local_108._0_4_ + local_f8;
    fStack_f4 = local_88.Min.y;
    fStack_e4 = local_108._4_4_ + fStack_f4;
    fStack_e0 = local_108._8_4_ + 0.0;
    fStack_dc = local_108._12_4_ + 0.0;
    fStack_f0 = 0.0;
    fStack_ec = 0.0;
    local_40.Max.x = 0.0;
    if (0.0 < auVar13._0_4_) {
      local_40.Max.x = (local_138->Style).ItemInnerSpacing.x + auVar13._0_4_;
    }
    _fStack_d0 = 0;
    local_d8._0_4_ = (local_138->Style).FramePadding.x;
    local_d8._4_4_ = (local_138->Style).FramePadding.y;
    local_40.Max.x = local_40.Max.x + local_e8;
    local_40.Max.y = fStack_e4 + 0.0;
    local_118 = label;
    local_88.Max.x = local_e8;
    local_88.Max.y = fStack_e4;
    local_40.Min = local_88.Min;
    ItemSize(&local_40,(local_138->Style).FramePadding.y);
    bVar3 = ItemAdd(&local_40,0,&local_88);
    uVar7 = 0xffffffff;
    if (bVar3) {
      bVar3 = ItemHoverable(&local_88,id);
      text = local_118;
      if (((local_b8 == 3.4028235e+38) && (!NAN(local_b8))) ||
         ((local_c8 == 3.4028235e+38 && (!NAN(local_c8))))) {
        if (values_count < 1) {
          local_128.x = -3.4028235e+38;
          fVar8 = 3.4028235e+38;
        }
        else {
          iVar6 = 0;
          local_128.x = -3.4028235e+38;
          local_128.y = 0.0;
          uStack_120._0_4_ = 0;
          uStack_120._4_4_ = 0;
          fVar8 = 3.4028235e+38;
          do {
            fVar9 = (*values_getter)(data,iVar6);
            if (!NAN(fVar9)) {
              if (fVar9 <= fVar8) {
                fVar8 = fVar9;
              }
              local_128.y = (float)((uint)local_128.y & extraout_var._0_4_);
              uStack_120._0_4_ = (uint)uStack_120 & extraout_var._4_4_;
              uStack_120._4_4_ = uStack_120._4_4_ & extraout_var._8_4_;
              local_128.x = (float)((uint)local_128.x & -(uint)(fVar9 <= local_128.x) |
                                   ~-(uint)(fVar9 <= local_128.x) & (uint)fVar9);
            }
            iVar6 = iVar6 + 1;
          } while (values_count != iVar6);
        }
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        local_b8 = (float)(~-(uint)(local_b8 == 3.4028235e+38) & (uint)local_b8 |
                          (uint)fVar8 & -(uint)(local_b8 == 3.4028235e+38));
        local_c8 = (float)(~-(uint)(local_c8 == 3.4028235e+38) & (uint)local_c8 |
                          (uint)local_128.x & -(uint)(local_c8 == 3.4028235e+38));
      }
      local_f8 = local_f8 + (float)local_d8._0_4_;
      fStack_f4 = fStack_f4 + (float)local_d8._4_4_;
      fStack_f0 = fStack_f0 + fStack_d0;
      fStack_ec = fStack_ec + fStack_cc;
      local_128 = local_88.Min;
      uStack_120 = 0;
      IVar11.y = local_88.Max.y;
      IVar11.x = local_88.Max.x;
      IVar4 = GetColorU32(7,1.0);
      RenderFrame(local_128,IVar11,IVar4,true,(local_138->Style).FrameRounding);
      uVar7 = 0xffffffff;
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        local_e8 = local_e8 - (float)local_d8._0_4_;
        fStack_e4 = fStack_e4 - (float)local_d8._4_4_;
        fStack_e0 = fStack_e0 - fStack_d0;
        fStack_dc = fStack_dc - fStack_cc;
        iVar6 = (int)(float)local_108._0_4_;
        if (values_count <= (int)(float)local_108._0_4_) {
          iVar6 = values_count;
        }
        fVar8 = (float)(values_count - (uint)(plot_type == ImGuiPlotType_Lines));
        local_128.x = fVar8;
        uVar7 = 0xffffffff;
        if ((((bVar3) && (fVar9 = (local_138->IO).MousePos.x, local_f8 <= fVar9)) &&
            (fVar10 = (local_138->IO).MousePos.y, fStack_f4 <= fVar10)) &&
           ((fVar9 < local_e8 && (fVar10 < fStack_e4)))) {
          fVar10 = (fVar9 - local_f8) / (local_e8 - local_f8);
          fVar9 = 0.9999;
          if (fVar10 <= 0.9999) {
            fVar9 = fVar10;
          }
          uVar7 = (uint)((float)(int)fVar8 * (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9));
          if (((int)uVar7 < 0) || (values_count <= (int)uVar7)) {
            __assert_fail("v_idx >= 0 && v_idx < values_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                          ,0x1756,
                          "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                         );
          }
          fVar8 = (*values_getter)(data,(int)(values_offset + uVar7) % values_count);
          (*values_getter)(data,(int)(values_offset + uVar7 + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar7,(ulong)(uVar7 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)fVar8,(ulong)uVar7);
          }
        }
        iVar6 = iVar6 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_108 = ZEXT416(~-(uint)(local_b8 == local_c8) & (uint)(1.0 / (local_c8 - local_b8)));
        fVar8 = (*values_getter)(data,values_offset % values_count);
        local_d8._0_4_ = fVar8;
        if (0.0 <= local_c8 * local_b8) {
          fVar8 = (float)(~-(uint)(local_b8 < 0.0) & 0x3f800000);
        }
        else {
          fVar8 = -local_b8 * (float)local_108._0_4_;
        }
        local_12c = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        local_130 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        text = local_118;
        if (0 < iVar6) {
          fVar10 = (float)local_108._0_4_ * ((float)local_d8._0_4_ - local_b8);
          fVar9 = 1.0;
          if (fVar10 <= 1.0) {
            fVar9 = fVar10;
          }
          _local_d8 = ZEXT416((uint)(1.0 / (float)iVar6));
          local_c8 = (float)(int)local_128.x;
          local_e8 = local_e8 - local_f8;
          fStack_e4 = fStack_e4 - fStack_f4;
          fStack_e0 = fStack_e0 - fStack_f0;
          fStack_dc = fStack_dc - fStack_ec;
          local_78 = fStack_f4;
          fStack_74 = fStack_f4;
          fStack_70 = fStack_f4;
          fStack_6c = fStack_f4;
          local_58 = fStack_e4 * fVar8 + fStack_f4;
          fVar8 = 0.0;
          fVar9 = (float)(-(uint)(fVar10 < 0.0) & 0x3f800000 |
                         ~-(uint)(fVar10 < 0.0) & (uint)(1.0 - fVar9));
          local_68 = fStack_e4;
          fStack_64 = fStack_e4;
          fStack_60 = fStack_e4;
          fStack_5c = fStack_e4;
          fStack_54 = fStack_e4;
          fStack_50 = fStack_e4;
          fStack_4c = fStack_e4;
          do {
            uVar5 = (uint)(fVar8 * local_c8 + 0.5);
            if (((int)uVar5 < 0) || (values_count <= (int)uVar5)) {
              __assert_fail("v1_idx >= 0 && v1_idx < values_count",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                            ,6000,
                            "int ImGui::PlotEx(ImGuiPlotType, const char *, float (*)(void *, int), void *, int, int, const char *, float, float, ImVec2)"
                           );
            }
            local_128.y = (float)local_d8._4_4_;
            local_128.x = (float)local_d8._0_4_ + fVar8;
            uStack_120 = local_d8._8_8_;
            fVar10 = (*values_getter)(data,(int)(values_offset + 1 + uVar5) % values_count);
            fVar16 = (fVar10 - local_b8) * (float)local_108._0_4_;
            fVar10 = 1.0;
            if (fVar16 <= 1.0) {
              fVar10 = fVar16;
            }
            fVar10 = (float)(-(uint)(fVar16 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar16 < 0.0) & (uint)(1.0 - fVar10));
            fVar8 = fVar8 * local_e8 + local_f8;
            local_110.y = fVar9 * fStack_e4 + fStack_f4;
            local_110.x = fVar8;
            local_140.x = local_e8 * local_128.x + local_f8;
            if (plot_type == ImGuiPlotType_Lines) {
              local_140.y = local_68 * fVar10 + local_78;
              IVar4 = local_12c;
              if (uVar7 == uVar5) {
                IVar4 = local_130;
              }
              ImDrawList::AddLine(local_a0->DrawList,&local_110,&local_140,IVar4,1.0);
            }
            else {
              local_140.y = local_58;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar8 + 2.0 <= local_140.x) {
                  local_140.x = local_140.x + -1.0;
                }
                IVar4 = local_12c;
                if (uVar7 == uVar5) {
                  IVar4 = local_130;
                }
                ImDrawList::AddRectFilled(local_a0->DrawList,&local_110,&local_140,IVar4,0.0,0xf);
              }
            }
            iVar6 = iVar6 + -1;
            text = local_118;
            fVar8 = local_128.x;
            fVar9 = fVar10;
          } while (iVar6 != 0);
        }
      }
      if (overlay_text != (char *)0x0) {
        local_110.y = local_88.Min.y + (local_138->Style).FramePadding.y;
        local_110.x = local_88.Min.x;
        local_140.x = 0.5;
        local_140.y = 0.0;
        RenderTextClipped(&local_110,&local_88.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_140
                          ,(ImRect *)0x0);
      }
      if (0.0 < local_98) {
        auVar2._4_4_ = fStack_f4;
        auVar2._0_4_ = local_f8;
        auVar2._8_4_ = fStack_f0;
        auVar2._12_4_ = fStack_ec;
        auVar12._4_12_ = auVar2._4_12_;
        auVar12._0_4_ = local_88.Max.x + (local_138->Style).ItemInnerSpacing.x;
        RenderText(auVar12._0_8_,text,(char *)0x0,true);
      }
    }
  }
  return uVar7;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx+1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f,0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}